

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O3

void __thiscall SharedDirectory::index_files(SharedDirectory *this)

{
  unsigned_long uVar1;
  uint64_t uVar2;
  ulong uVar3;
  directory_iterator itr;
  directory_iterator end;
  uint64_t size;
  path file;
  directory_iterator local_88;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  unsigned_long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_80.px = (dir_itr_imp *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *)this);
  boost::filesystem::directory_iterator::directory_iterator(&local_88,&this->shared_dir,none);
  uVar3 = 0;
  while( true ) {
    if (local_88.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_80.px)
    break;
    if ((local_88.m_imp.px == (dir_itr_imp *)0x0) ||
       (*(long *)((long)local_88.m_imp.px + 0x38) == 0)) {
      if ((local_80.px == (dir_itr_imp *)0x0) || (*(long *)(local_80.px + 0x38) == 0)) break;
      if ((local_88.m_imp.px == (dir_itr_imp *)0x0) ||
         (*(long *)((long)local_88.m_imp.px + 0x38) == 0)) goto LAB_0010f3ba;
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,*(long *)((long)local_88.m_imp.px + 8),
               *(long *)((long)local_88.m_imp.px + 0x10) + *(long *)((long)local_88.m_imp.px + 8));
    if ((local_88.m_imp.px == (dir_itr_imp *)0x0) ||
       (*(long *)((long)local_88.m_imp.px + 0x38) == 0)) {
LAB_0010f3ba:
      __assert_fail("(!is_end())&&(\"attempt to dereference end directory iterator\")",
                    "/usr/include/boost/filesystem/directory.hpp",0x140,
                    "boost::iterator_facade<directory_iterator, directory_entry, boost::single_pass_traversal_tag>::reference boost::filesystem::directory_iterator::dereference() const"
                   );
    }
    boost::filesystem::detail::status((path *)&local_78,(error_code *)((long)local_88.m_imp.px + 8))
    ;
    if ((int)local_78._M_dataplus._M_p == 2) {
      uVar1 = boost::filesystem::detail::file_size((path *)local_50,(error_code *)0x0);
      local_58 = uVar1;
      boost::filesystem::path::filename();
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,unsigned_long&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  *)this,&local_78,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + uVar1;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    boost::filesystem::detail::directory_iterator_increment(&local_88,(error_code *)0x0);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_88.m_imp);
  uVar2 = 0;
  if (uVar3 <= this->total_space) {
    uVar2 = this->total_space - uVar3;
  }
  this->remaining_space = uVar2;
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_80);
  return;
}

Assistant:

void SharedDirectory::index_files() {
  directory_iterator end;
  uint64_t actual_space = 0;
  indexed_files.clear();
  for (directory_iterator itr{shared_dir}; itr != end; ++itr) {
    auto file = itr->path();
    if (!is_regular_file(itr->path())) {
      continue;
    }
    uint64_t size = file_size(file);
    actual_space += size;
    indexed_files.emplace(file.filename().string(), size);
  }
  remaining_space = total_space < actual_space ? 0 : total_space - actual_space;
}